

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

Status __thiscall leveldb::Footer::DecodeFrom(Footer *this,Slice *input)

{
  char *pcVar1;
  long lVar2;
  long *in_RDX;
  long lVar3;
  Slice local_40;
  Slice local_30;
  
  lVar3 = *in_RDX;
  if (*(long *)(lVar3 + 0x28) == -0x24b88adb747f04a9) {
    BlockHandle::DecodeFrom(&this->metaindex_handle_,input);
    if ((this->metaindex_handle_).offset_ == 0) {
      BlockHandle::DecodeFrom((BlockHandle *)&local_40,input + 1);
      pcVar1 = (char *)(this->metaindex_handle_).offset_;
      (this->metaindex_handle_).offset_ = (uint64_t)local_40.data_;
      if (pcVar1 != (char *)0x0) {
        local_40.data_ = pcVar1;
        operator_delete__(pcVar1);
        local_40.data_ = (char *)(this->metaindex_handle_).offset_;
      }
      if (local_40.data_ == (char *)0x0) {
        lVar2 = *in_RDX;
        lVar3 = lVar3 + 0x30;
        *in_RDX = lVar3;
        in_RDX[1] = (lVar2 + in_RDX[1]) - lVar3;
      }
    }
  }
  else {
    local_40.data_ = "not an sstable (bad magic number)";
    local_40.size_ = 0x21;
    local_30.data_ = "";
    local_30.size_ = 0;
    Status::Status((Status *)this,kCorruption,&local_40,&local_30);
  }
  return (Status)(char *)this;
}

Assistant:

Status Footer::DecodeFrom(Slice* input) {
  const char* magic_ptr = input->data() + kEncodedLength - 8;
  const uint32_t magic_lo = DecodeFixed32(magic_ptr);
  const uint32_t magic_hi = DecodeFixed32(magic_ptr + 4);
  const uint64_t magic = ((static_cast<uint64_t>(magic_hi) << 32) |
                          (static_cast<uint64_t>(magic_lo)));
  if (magic != kTableMagicNumber) {
    return Status::Corruption("not an sstable (bad magic number)");
  }

  Status result = metaindex_handle_.DecodeFrom(input);
  if (result.ok()) {
    result = index_handle_.DecodeFrom(input);
  }
  if (result.ok()) {
    // We skip over any leftover data (just padding for now) in "input"
    const char* end = magic_ptr + 8;
    *input = Slice(end, input->data() + input->size() - end);
  }
  return result;
}